

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool print_array(cJSON *item,printbuffer *output_buffer)

{
  size_t sVar1;
  cJSON_bool cVar2;
  uchar *puVar3;
  size_t sVar4;
  cJSON_bool cVar5;
  ulong uVar6;
  cJSON *item_00;
  
  cVar5 = 0;
  if (output_buffer != (printbuffer *)0x0) {
    item_00 = item->child;
    puVar3 = ensure(output_buffer,1);
    cVar5 = 0;
    if (puVar3 != (uchar *)0x0) {
      *puVar3 = '[';
      output_buffer->offset = output_buffer->offset + 1;
      output_buffer->depth = output_buffer->depth + 1;
      for (; item_00 != (cJSON *)0x0; item_00 = item_00->next) {
        cVar2 = print_value(item_00,output_buffer);
        if (cVar2 == 0) {
          return 0;
        }
        if (output_buffer->buffer != (uchar *)0x0) {
          sVar1 = output_buffer->offset;
          sVar4 = strlen((char *)(output_buffer->buffer + sVar1));
          output_buffer->offset = sVar4 + sVar1;
        }
        if (item_00->next != (cJSON *)0x0) {
          uVar6 = (ulong)(output_buffer->format == 0);
          puVar3 = ensure(output_buffer,uVar6 ^ 3);
          if (puVar3 == (uchar *)0x0) {
            return 0;
          }
          *puVar3 = ',';
          if (output_buffer->format == 0) {
            puVar3 = puVar3 + 1;
          }
          else {
            puVar3[1] = ' ';
            puVar3 = puVar3 + 2;
          }
          *puVar3 = '\0';
          output_buffer->offset = output_buffer->offset + (2 - uVar6);
        }
      }
      puVar3 = ensure(output_buffer,2);
      if (puVar3 != (uchar *)0x0) {
        puVar3[0] = ']';
        puVar3[1] = '\0';
        output_buffer->depth = output_buffer->depth - 1;
        cVar5 = 1;
      }
    }
  }
  return cVar5;
}

Assistant:

static cJSON_bool print_array(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    size_t length = 0;
    cJSON *current_element = item->child;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* Compose the output array. */
    /* opening square bracket */
    output_pointer = ensure(output_buffer, 1);
    if (output_pointer == NULL)
    {
        return false;
    }

    *output_pointer = '[';
    output_buffer->offset++;
    output_buffer->depth++;

    while (current_element != NULL)
    {
        if (!print_value(current_element, output_buffer))
        {
            return false;
        }
        update_offset(output_buffer);
        if (current_element->next)
        {
            length = (size_t) (output_buffer->format ? 2 : 1);
            output_pointer = ensure(output_buffer, length + 1);
            if (output_pointer == NULL)
            {
                return false;
            }
            *output_pointer++ = ',';
            if(output_buffer->format)
            {
                *output_pointer++ = ' ';
            }
            *output_pointer = '\0';
            output_buffer->offset += length;
        }
        current_element = current_element->next;
    }

    output_pointer = ensure(output_buffer, 2);
    if (output_pointer == NULL)
    {
        return false;
    }
    *output_pointer++ = ']';
    *output_pointer = '\0';
    output_buffer->depth--;

    return true;
}